

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  value_type vVar1;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __first;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first_00;
  bool bVar2;
  float *pfVar3;
  size_type sVar4;
  reference pvVar5;
  reference this_00;
  reference pvVar6;
  reference pvVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar8;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  vector<float,_std::allocator<float>_> *class_bbox_scores_1;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *class_bbox_rects_1;
  int i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  int z;
  int j_1;
  vector<int,_std::allocator<int>_> picked;
  BBoxRect c;
  float *bbox_1;
  float score;
  int j;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> class_bbox_rects;
  int i_1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float pb_cy;
  float pb_cx;
  float pb_h;
  float pb_w;
  float *bbox;
  float *var;
  float *pb;
  float *loc;
  int i;
  float *variance_ptr;
  float *priorbox_ptr;
  float *location_ptr;
  Mat bboxes;
  int num_class_copy;
  int num_prior;
  bool mxnet_ssd_style;
  Mat *priorbox;
  Mat *confidence;
  Mat *location;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffca8;
  Mat *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  int iVar9;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcc0;
  iterator in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  const_iterator in_stack_fffffffffffffd08;
  float local_2e4;
  float *in_stack_fffffffffffffd40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd48;
  vector<int,_std::allocator<int>_> *bboxes_00;
  int local_288;
  int local_284;
  int local_25c;
  int local_1e4;
  vector<float,_std::allocator<float>_> local_1e0;
  undefined1 local_1c8 [32];
  vector<int,_std::allocator<int>_> local_1a8;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  int local_17c;
  BBoxRect *local_178;
  float local_170;
  int local_16c;
  vector<float,_std::allocator<float>_> local_168;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_150;
  int local_134;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_130;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_118;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  int local_bc;
  vector<int,_std::allocator<int>_> *local_b8;
  float *local_b0;
  float *local_a8;
  undefined4 local_a0;
  Mat local_90;
  int local_4c;
  int local_48;
  byte local_41;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_41 = *(int *)(in_RDI + 0x80) == -0xe9;
  if ((bool)local_41) {
    local_284 = local_40->h;
  }
  else {
    local_284 = local_40->w / 4;
  }
  local_48 = local_284;
  if ((bool)local_41) {
    local_288 = local_38->h;
  }
  else {
    local_288 = *(int *)(in_RDI + 0x80);
  }
  local_4c = local_288;
  Mat::Mat(&local_90);
  Mat::create(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8._M_current >> 0x20),
              (int)in_stack_fffffffffffffcc8._M_current,(size_t)in_stack_fffffffffffffcc0,
              (Allocator *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  bVar2 = Mat::empty(in_stack_fffffffffffffcb0);
  if (bVar2) {
    local_4 = -100;
    local_a0 = 1;
  }
  else {
    local_a8 = Mat::operator_cast_to_float_(local_30);
    local_b0 = Mat::row(local_40,0);
    if ((local_41 & 1) == 0) {
      in_stack_fffffffffffffd48 = (vector<int,_std::allocator<int>_> *)Mat::row(local_40,1);
      bboxes_00 = in_stack_fffffffffffffd48;
    }
    else {
      bboxes_00 = (vector<int,_std::allocator<int>_> *)0x0;
    }
    local_b8 = bboxes_00;
    for (local_bc = 0; local_bc < local_48; local_bc = local_bc + 1) {
      local_c8 = local_a8 + (local_bc << 2);
      local_d0 = local_b0 + (local_bc << 2);
      if (local_b8 == (vector<int,_std::allocator<int>_> *)0x0) {
        in_stack_fffffffffffffd40 = (float *)(in_RDI + 0x94);
      }
      else {
        in_stack_fffffffffffffd40 =
             (float *)((long)&(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + (long)(local_bc << 2) * 4);
      }
      local_d8 = in_stack_fffffffffffffd40;
      local_e0 = Mat::row(&local_90,local_bc);
      local_e4 = local_d0[2] - *local_d0;
      local_e8 = local_d0[3] - local_d0[1];
      local_ec = (*local_d0 + local_d0[2]) * 0.5;
      local_f0 = (local_d0[1] + local_d0[3]) * 0.5;
      local_f4 = *local_d8 * *local_c8 * local_e4 + local_ec;
      local_f8 = local_d8[1] * local_c8[1] * local_e8 + local_f0;
      dVar8 = std::exp((double)(ulong)(uint)(local_d8[2] * local_c8[2]));
      local_fc = SUB84(dVar8,0) * local_e4;
      dVar8 = std::exp((double)(ulong)(uint)(local_d8[3] * local_c8[3]));
      local_100 = SUB84(dVar8,0) * local_e8;
      *local_e0 = local_f4 - local_fc * 0.5;
      local_e0[1] = local_f8 - local_100 * 0.5;
      local_e0[2] = local_f4 + local_fc * 0.5;
      local_e0[3] = local_f8 + local_100 * 0.5;
    }
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x1947ea);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x1947f7);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8._M_current);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8._M_current);
    for (local_134 = 1; local_134 < local_4c; local_134 = local_134 + 1) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x194851);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x19485e);
      for (local_16c = 0; local_16c < local_48; local_16c = local_16c + 1) {
        if ((local_41 & 1) == 0) {
          pfVar3 = Mat::operator[](local_38,local_16c * local_4c + local_134);
          local_2e4 = *pfVar3;
        }
        else {
          pfVar3 = Mat::operator[](local_38,local_134 * local_48 + local_16c);
          local_2e4 = *pfVar3;
        }
        local_170 = local_2e4;
        if (*(float *)(in_RDI + 0x90) <= local_2e4 && local_2e4 != *(float *)(in_RDI + 0x90)) {
          in_stack_fffffffffffffd08._M_current = (BBoxRect *)Mat::row(&local_90,local_16c);
          local_18c = (in_stack_fffffffffffffd08._M_current)->xmin;
          local_188 = (in_stack_fffffffffffffd08._M_current)->ymin;
          local_184 = (in_stack_fffffffffffffd08._M_current)->xmax;
          local_180 = (in_stack_fffffffffffffd08._M_current)->ymax;
          local_17c = local_134;
          local_178 = in_stack_fffffffffffffd08._M_current;
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                     in_stack_fffffffffffffcc0,
                     (value_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          std::vector<float,_std::allocator<float>_>::push_back
                    (in_stack_fffffffffffffcc0,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        }
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffcc0,
                 (vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      in_stack_fffffffffffffd04 = *(int *)(in_RDI + 0x88);
      sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_150);
      if (in_stack_fffffffffffffd04 < (int)sVar4) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8._M_current);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcd0,
                   (size_type)in_stack_fffffffffffffcc8._M_current);
      }
      in_stack_fffffffffffffcf8._M_current = (BBoxRect *)&local_1a8;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x194ac8);
      nms_sorted_bboxes((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)bboxes_00,
                        in_stack_fffffffffffffd48,(float)((ulong)in_stack_fffffffffffffd40 >> 0x20))
      ;
      local_1c8._28_4_ = 0;
      while( true ) {
        in_stack_fffffffffffffcf4 = local_1c8._28_4_;
        sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_1a8);
        if ((int)sVar4 <= in_stack_fffffffffffffcf4) break;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_1a8,(long)(int)local_1c8._28_4_);
        local_1c8._24_4_ = *pvVar5;
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::operator[](&local_118,(long)local_134);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  (&local_150,(long)(int)local_1c8._24_4_);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffcc0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[](&local_130,(long)local_134);
        std::vector<float,_std::allocator<float>_>::operator[]
                  (&local_168,(long)(int)local_1c8._24_4_);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffffcc0,
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        local_1c8._28_4_ = local_1c8._28_4_ + 1;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffcc0);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffcc0);
    }
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x194c5c);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x194c69);
    for (local_1e4 = 1; local_1e4 < local_4c; local_1e4 = local_1e4 + 1) {
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::operator[](&local_118,(long)local_1e4);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](&local_130,(long)local_1e4);
      in_stack_fffffffffffffcd0 = (Mat *)local_1c8;
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffca8);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffcb0,
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffca8);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffca8);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffca8);
      __first._M_current._4_4_ = in_stack_fffffffffffffd04;
      __first._M_current._0_4_ = in_stack_fffffffffffffd00;
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffd08,__first,in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffcc0 = &local_1e0;
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffca8);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffcb0,
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffca8);
      std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffca8);
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffca8);
      __first_00._M_current._4_4_ = in_stack_fffffffffffffd04;
      __first_00._M_current._0_4_ = in_stack_fffffffffffffd00;
      in_stack_fffffffffffffcc8 =
           std::vector<float,std::allocator<float>>::
           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                     ((vector<float,_std::allocator<float>_> *)
                      CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                      (const_iterator)in_stack_fffffffffffffd08._M_current,__first_00,
                      (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                      )in_stack_fffffffffffffcf8._M_current);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffcc0,
               (vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    iVar9 = *(int *)(in_RDI + 0x8c);
    sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_1c8);
    if (iVar9 < (int)sVar4) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8._M_current);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcd0,
                 (size_type)in_stack_fffffffffffffcc8._M_current);
    }
    sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_1c8);
    if ((int)sVar4 == 0) {
      local_4 = 0;
    }
    else {
      this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
      Mat::create(in_stack_fffffffffffffcd0,
                  (int)((ulong)in_stack_fffffffffffffcc8._M_current >> 0x20),
                  (int)in_stack_fffffffffffffcc8._M_current,(size_t)in_stack_fffffffffffffcc0,
                  (Allocator *)CONCAT44(iVar9,in_stack_fffffffffffffcb8));
      bVar2 = Mat::empty(in_stack_fffffffffffffcb0);
      if (bVar2) {
        local_4 = -100;
      }
      else {
        for (local_25c = 0; local_25c < (int)sVar4; local_25c = local_25c + 1) {
          pvVar6 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                             ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_1c8,
                              (long)local_25c);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_1e0,(long)local_25c);
          vVar1 = *pvVar7;
          pfVar3 = Mat::row(this_00,local_25c);
          *pfVar3 = (float)pvVar6->label;
          pfVar3[1] = vVar1;
          pfVar3[2] = pvVar6->xmin;
          pfVar3[3] = pvVar6->ymin;
          pfVar3[4] = pvVar6->xmax;
          pfVar3[5] = pvVar6->ymax;
        }
        local_4 = 0;
      }
    }
    local_a0 = 1;
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffcc0);
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffcc0)
    ;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffcc0);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffcc0);
  }
  Mat::~Mat((Mat *)0x195105);
  return local_4;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}